

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O1

int run_test_spawn_affinity(void)

{
  uint uVar1;
  int iVar2;
  int extraout_EAX;
  int *piVar3;
  ulong uVar4;
  uv_process_options_t *loop;
  uv_loop_t *puVar5;
  ulong uVar6;
  uv_buf_t *buf;
  anon_union_8_2_13e1ed65_for_data unaff_RBX;
  undefined1 *nread;
  uv_stream_t *stream;
  uv_process_options_t *unaff_R14;
  uv_signal_s *__nmemb;
  int64_t eval_b;
  char cpustr [11];
  int64_t eval_b_2;
  cpu_set_t cpuset;
  undefined1 auStack_8d8 [24];
  uv_buf_t uStack_8c0;
  uv_fs_t uStack_8a8;
  uv_pipe_t uStack_6e8;
  uv_stdio_container_t uStack_600;
  undefined4 uStack_5f0;
  undefined4 uStack_5e0;
  anon_union_8_2_13e1ed65_for_data aStack_5c8;
  long lStack_590;
  uint uStack_588;
  int iStack_584;
  uv_buf_t uStack_580;
  char acStack_570 [16];
  uv_stdio_container_t uStack_560;
  uv_write_t uStack_550;
  uv_write_t uStack_488;
  uv_stream_t uStack_3c0;
  uv_fs_t uStack_2d8;
  anon_union_8_2_13e1ed65_for_data aStack_118;
  uv_signal_s *puStack_110;
  uv_signal_s *puStack_108;
  uv_signal_s *puStack_100;
  anon_union_8_2_13e1ed65_for_data aStack_f8;
  char cStack_e1;
  uv__queue *puStack_e0;
  uv__queue *puStack_d8;
  anon_union_8_2_13e1ed65_for_data aStack_d0;
  uv_signal_s *local_c8;
  uv_signal_s *local_c0 [2];
  uv_signal_s *local_b0;
  cpu_set_t local_a8;
  
  aStack_d0 = (anon_union_8_2_13e1ed65_for_data)0x1beddf;
  uVar1 = uv_cpumask_size();
  if ((int)uVar1 < 1) {
    aStack_d0 = (anon_union_8_2_13e1ed65_for_data)0x1befd4;
    run_test_spawn_affinity_cold_1();
LAB_001befd4:
    aStack_d0 = (anon_union_8_2_13e1ed65_for_data)0x1befe1;
    run_test_spawn_affinity_cold_2();
LAB_001befe1:
    aStack_d0 = (anon_union_8_2_13e1ed65_for_data)0x1befee;
    run_test_spawn_affinity_cold_3();
LAB_001befee:
    loop = (uv_process_options_t *)unaff_RBX;
    aStack_d0 = (anon_union_8_2_13e1ed65_for_data)0x1beff3;
    run_test_spawn_affinity_cold_9();
LAB_001beff3:
    aStack_d0 = (anon_union_8_2_13e1ed65_for_data)0x1beff8;
    run_test_spawn_affinity_cold_4();
LAB_001beff8:
    aStack_d0 = (anon_union_8_2_13e1ed65_for_data)0x1beffd;
    run_test_spawn_affinity_cold_5();
LAB_001beffd:
    aStack_d0 = (anon_union_8_2_13e1ed65_for_data)0x1bf002;
    run_test_spawn_affinity_cold_6();
LAB_001bf002:
    aStack_d0 = (anon_union_8_2_13e1ed65_for_data)0x1bf007;
    run_test_spawn_affinity_cold_7();
  }
  else {
    unaff_RBX._4_4_ = 0;
    unaff_RBX.file = uVar1;
    local_a8.__bits[0xe] = 0;
    local_a8.__bits[0xf] = 0;
    local_a8.__bits[0xc] = 0;
    local_a8.__bits[0xd] = 0;
    local_a8.__bits[10] = 0;
    local_a8.__bits[0xb] = 0;
    local_a8.__bits[8] = 0;
    local_a8.__bits[9] = 0;
    local_a8.__bits[6] = 0;
    local_a8.__bits[7] = 0;
    local_a8.__bits[4] = 0;
    local_a8.__bits[5] = 0;
    local_a8.__bits[2] = 0;
    local_a8.__bits[3] = 0;
    local_a8.__bits[0] = 0;
    local_a8.__bits[1] = 0;
    unaff_R14 = (uv_process_options_t *)0x0;
    aStack_d0 = (anon_union_8_2_13e1ed65_for_data)0x1bee1f;
    iVar2 = sched_getaffinity(0,0x80,&local_a8);
    if (iVar2 != 0) {
      aStack_d0 = (anon_union_8_2_13e1ed65_for_data)0x1bee28;
      piVar3 = __errno_location();
      unaff_R14 = (uv_process_options_t *)(long)*piVar3;
    }
    local_c8 = (uv_signal_s *)0x0;
    local_c0[0] = (uv_signal_s *)unaff_R14;
    if ((uv_signal_s *)unaff_R14 != (uv_signal_s *)0x0) goto LAB_001befd4;
    uVar6 = 1;
    if (1 < (int)uVar1) {
      uVar6 = (ulong)uVar1;
    }
    uVar4 = 0;
    do {
      if ((uVar4 < 0x400) && ((local_a8.__bits[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) != 0))
      goto LAB_001bee78;
      uVar4 = uVar4 + 1;
    } while (uVar6 != uVar4);
    uVar4 = (ulong)uVar1;
LAB_001bee78:
    unaff_R14 = (uv_process_options_t *)(uVar4 & 0xffffffff);
    __nmemb = (uv_signal_s *)(ulong)uVar1;
    local_c8 = __nmemb;
    local_c0[0] = (uv_signal_s *)unaff_R14;
    if (__nmemb <= unaff_R14) goto LAB_001befe1;
    aStack_d0 = (anon_union_8_2_13e1ed65_for_data)0x1beeb4;
    snprintf((char *)local_c0,0xb,"%d",unaff_R14);
    aStack_d0 = (anon_union_8_2_13e1ed65_for_data)0x1beec7;
    init_process_options("spawn_helper_affinity",exit_cb);
    aStack_d0 = (anon_union_8_2_13e1ed65_for_data)0x1beed4;
    loop = (uv_process_options_t *)calloc((size_t)__nmemb,1);
    if ((uv_loop_t *)loop == (uv_loop_t *)0x0) goto LAB_001befee;
    *(undefined1 *)((long)&((uv_signal_s *)unaff_R14)->data + (long)&((uv_stream_t *)loop)->data) =
         1;
    unaff_R14 = &options;
    options.cpumask = (char *)loop;
    options.cpumask_size = (size_t)__nmemb;
    options.args[2] = (char *)local_c0;
    options.args[3] = "dummy";
    aStack_d0 = (anon_union_8_2_13e1ed65_for_data)0x1bef1c;
    puVar5 = uv_default_loop();
    aStack_d0 = (anon_union_8_2_13e1ed65_for_data)0x1bef2e;
    iVar2 = uv_spawn(puVar5,&process,&options);
    if (iVar2 != 0) goto LAB_001beff3;
    aStack_d0 = (anon_union_8_2_13e1ed65_for_data)0x1bef3b;
    puVar5 = uv_default_loop();
    aStack_d0 = (anon_union_8_2_13e1ed65_for_data)0x1bef45;
    iVar2 = uv_run(puVar5,UV_RUN_DEFAULT);
    if (iVar2 != 0) goto LAB_001beff8;
    if (exit_cb_called != 1) goto LAB_001beffd;
    if (close_cb_called != 1) goto LAB_001bf002;
    aStack_d0 = (anon_union_8_2_13e1ed65_for_data)0x1bef6f;
    free(loop);
    aStack_d0 = (anon_union_8_2_13e1ed65_for_data)0x1bef74;
    loop = (uv_process_options_t *)uv_default_loop();
    aStack_d0 = (anon_union_8_2_13e1ed65_for_data)0x1bef88;
    uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
    aStack_d0 = (anon_union_8_2_13e1ed65_for_data)0x1bef92;
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    local_c8 = (uv_signal_s *)0x0;
    aStack_d0 = (anon_union_8_2_13e1ed65_for_data)0x1bef9f;
    puVar5 = uv_default_loop();
    aStack_d0 = (anon_union_8_2_13e1ed65_for_data)0x1befa7;
    iVar2 = uv_loop_close(puVar5);
    local_b0 = (uv_signal_s *)(long)iVar2;
    if (local_c8 == local_b0) {
      aStack_d0 = (anon_union_8_2_13e1ed65_for_data)0x1befbe;
      uv_library_shutdown();
      return 0;
    }
  }
  aStack_d0.stream = (uv_stream_t *)run_test_spawn_affinity_invalid_mask;
  run_test_spawn_affinity_cold_8();
  aStack_f8 = (anon_union_8_2_13e1ed65_for_data)0x1bf01e;
  aStack_d0 = (anon_union_8_2_13e1ed65_for_data)loop;
  iVar2 = uv_cpumask_size();
  if (iVar2 < 1) {
    aStack_f8 = (anon_union_8_2_13e1ed65_for_data)0x1bf0dd;
    run_test_spawn_affinity_invalid_mask_cold_1();
LAB_001bf0dd:
    aStack_f8 = (anon_union_8_2_13e1ed65_for_data)0x1bf0e2;
    run_test_spawn_affinity_invalid_mask_cold_2();
LAB_001bf0e2:
    aStack_f8 = (anon_union_8_2_13e1ed65_for_data)0x1bf0e7;
    run_test_spawn_affinity_invalid_mask_cold_3();
  }
  else {
    aStack_f8 = (anon_union_8_2_13e1ed65_for_data)0x1bf039;
    init_process_options("",exit_cb);
    options.cpumask = &cStack_e1;
    cStack_e1 = '\0';
    options.cpumask_size = 0;
    loop = &options;
    aStack_f8 = (anon_union_8_2_13e1ed65_for_data)0x1bf05f;
    puVar5 = uv_default_loop();
    aStack_f8 = (anon_union_8_2_13e1ed65_for_data)0x1bf071;
    iVar2 = uv_spawn(puVar5,&process,&options);
    if (iVar2 != -0x16) goto LAB_001bf0dd;
    if (exit_cb_called != 0) goto LAB_001bf0e2;
    aStack_f8 = (anon_union_8_2_13e1ed65_for_data)0x1bf084;
    loop = (uv_process_options_t *)uv_default_loop();
    aStack_f8 = (anon_union_8_2_13e1ed65_for_data)0x1bf098;
    uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
    aStack_f8 = (anon_union_8_2_13e1ed65_for_data)0x1bf0a2;
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    puStack_d8 = (uv__queue *)0x0;
    aStack_f8 = (anon_union_8_2_13e1ed65_for_data)0x1bf0b0;
    puVar5 = uv_default_loop();
    aStack_f8 = (anon_union_8_2_13e1ed65_for_data)0x1bf0b8;
    iVar2 = uv_loop_close(puVar5);
    puStack_e0 = (uv__queue *)(long)iVar2;
    if (puStack_d8 == puStack_e0) {
      aStack_f8 = (anon_union_8_2_13e1ed65_for_data)0x1bf0d0;
      uv_library_shutdown();
      return 0;
    }
  }
  aStack_f8.stream = (uv_stream_t *)run_test_spawn_auto_unref;
  run_test_spawn_affinity_invalid_mask_cold_4();
  puStack_110 = (uv_signal_s *)0x1bf109;
  aStack_f8 = (anon_union_8_2_13e1ed65_for_data)loop;
  init_process_options("spawn_helper1",(uv_exit_cb)0x0);
  puStack_110 = (uv_signal_s *)0x1bf10e;
  puVar5 = uv_default_loop();
  puStack_110 = (uv_signal_s *)0x1bf124;
  iVar2 = uv_spawn(puVar5,&process,&options);
  puStack_100 = (uv_signal_s *)(long)iVar2;
  puStack_108 = (uv_signal_s *)0x0;
  if (puStack_100 == (uv_signal_s *)0x0) {
    puStack_110 = (uv_signal_s *)0x1bf147;
    puVar5 = uv_default_loop();
    puStack_110 = (uv_signal_s *)0x1bf151;
    iVar2 = uv_run(puVar5,UV_RUN_DEFAULT);
    puStack_100 = (uv_signal_s *)(long)iVar2;
    puStack_108 = (uv_signal_s *)0x0;
    if (puStack_100 != (uv_signal_s *)0x0) goto LAB_001bf262;
    puStack_110 = (uv_signal_s *)0x1bf17b;
    iVar2 = uv_is_closing((uv_handle_t *)&process);
    puStack_100 = (uv_signal_s *)(long)iVar2;
    puStack_108 = (uv_signal_s *)0x0;
    if (puStack_100 != (uv_signal_s *)0x0) goto LAB_001bf26f;
    puStack_110 = (uv_signal_s *)0x1bf1a7;
    uv_close((uv_handle_t *)&process,(uv_close_cb)0x0);
    puStack_110 = (uv_signal_s *)0x1bf1ac;
    puVar5 = uv_default_loop();
    puStack_110 = (uv_signal_s *)0x1bf1b6;
    iVar2 = uv_run(puVar5,UV_RUN_DEFAULT);
    puStack_100 = (uv_signal_s *)(long)iVar2;
    puStack_108 = (uv_signal_s *)0x0;
    if (puStack_100 != (uv_signal_s *)0x0) goto LAB_001bf27c;
    puStack_100 = (uv_signal_s *)0x1;
    puStack_110 = (uv_signal_s *)0x1bf1e9;
    iVar2 = uv_is_closing((uv_handle_t *)&process);
    puStack_108 = (uv_signal_s *)(long)iVar2;
    if (puStack_100 != puStack_108) goto LAB_001bf289;
    puStack_110 = (uv_signal_s *)0x1bf203;
    loop = (uv_process_options_t *)uv_default_loop();
    puStack_110 = (uv_signal_s *)0x1bf217;
    uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
    puStack_110 = (uv_signal_s *)0x1bf221;
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    puStack_100 = (uv_signal_s *)0x0;
    puStack_110 = (uv_signal_s *)0x1bf22f;
    puVar5 = uv_default_loop();
    puStack_110 = (uv_signal_s *)0x1bf237;
    iVar2 = uv_loop_close(puVar5);
    puStack_108 = (uv_signal_s *)(long)iVar2;
    if (puStack_100 == puStack_108) {
      puStack_110 = (uv_signal_s *)0x1bf24d;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_110 = (uv_signal_s *)0x1bf262;
    run_test_spawn_auto_unref_cold_1();
LAB_001bf262:
    puStack_110 = (uv_signal_s *)0x1bf26f;
    run_test_spawn_auto_unref_cold_2();
LAB_001bf26f:
    puStack_110 = (uv_signal_s *)0x1bf27c;
    run_test_spawn_auto_unref_cold_3();
LAB_001bf27c:
    puStack_110 = (uv_signal_s *)0x1bf289;
    run_test_spawn_auto_unref_cold_4();
LAB_001bf289:
    puStack_110 = (uv_signal_s *)0x1bf296;
    run_test_spawn_auto_unref_cold_5();
  }
  puStack_110 = (uv_signal_s *)run_test_spawn_fs_open;
  run_test_spawn_auto_unref_cold_6();
  builtin_strncpy(acStack_570,"/dev/null",10);
  aStack_118 = (anon_union_8_2_13e1ed65_for_data)loop;
  puStack_110 = (uv_signal_s *)unaff_R14;
  iVar2 = uv_fs_open((uv_loop_t *)0x0,&uStack_2d8,acStack_570,2,0,(uv_fs_cb)0x0);
  uStack_3c0.data = (void *)(long)iVar2;
  uStack_488.data = (void *)0x0;
  if (uStack_3c0.data == (void *)0x0) {
    uStack_588 = (undefined4)uStack_2d8.result;
    init_process_options("spawn_helper8",exit_cb);
    puVar5 = uv_default_loop();
    loop = (uv_process_options_t *)&uStack_3c0;
    iVar2 = uv_pipe_init(puVar5,(uv_pipe_t *)loop,0);
    uStack_488.data = (void *)(long)iVar2;
    uStack_550.data = (void *)0x0;
    if (uStack_488.data != (void *)0x0) goto LAB_001bf5ba;
    options.stdio = &uStack_560;
    uStack_560.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
    options.stdio_count = 1;
    uStack_560.data.stream = (uv_stream_t *)loop;
    iStack_584 = dup(uStack_588);
    puVar5 = uv_default_loop();
    iVar2 = uv_spawn(puVar5,&process,&options);
    uStack_488.data = (void *)(long)iVar2;
    uStack_550.data = (void *)0x0;
    if (uStack_488.data != (void *)0x0) goto LAB_001bf5cc;
    uStack_580 = uv_buf_init((char *)&uStack_588,4);
    iVar2 = uv_write(&uStack_488,&uStack_3c0,&uStack_580,1,write_null_cb);
    uStack_550.data = (void *)(long)iVar2;
    if (uStack_550.data != (void *)0x0) goto LAB_001bf5de;
    uStack_580 = uv_buf_init((char *)&iStack_584,4);
    iVar2 = uv_write(&uStack_550,&uStack_3c0,&uStack_580,1,write_cb);
    lStack_590 = 0;
    if (iVar2 != 0) goto LAB_001bf5ed;
    puVar5 = uv_default_loop();
    iVar2 = uv_run(puVar5,UV_RUN_DEFAULT);
    lStack_590 = 0;
    if (iVar2 != 0) goto LAB_001bf5fc;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&uStack_2d8,uStack_588,(uv_fs_cb)0x0);
    lStack_590 = 0;
    if (iVar2 != 0) goto LAB_001bf60b;
    lStack_590 = (long)exit_cb_called;
    if (lStack_590 != 1) goto LAB_001bf61a;
    lStack_590 = (long)close_cb_called;
    if (lStack_590 != 2) goto LAB_001bf629;
    loop = (uv_process_options_t *)uv_default_loop();
    uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    puVar5 = uv_default_loop();
    iVar2 = uv_loop_close(puVar5);
    lStack_590 = (long)iVar2;
    if (lStack_590 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_fs_open_cold_1();
LAB_001bf5ba:
    run_test_spawn_fs_open_cold_2();
LAB_001bf5cc:
    run_test_spawn_fs_open_cold_3();
LAB_001bf5de:
    run_test_spawn_fs_open_cold_4();
LAB_001bf5ed:
    run_test_spawn_fs_open_cold_5();
LAB_001bf5fc:
    run_test_spawn_fs_open_cold_6();
LAB_001bf60b:
    run_test_spawn_fs_open_cold_7();
LAB_001bf61a:
    run_test_spawn_fs_open_cold_8();
LAB_001bf629:
    run_test_spawn_fs_open_cold_9();
  }
  iVar2 = (int)&lStack_590;
  run_test_spawn_fs_open_cold_10();
  if (iVar2 == 0) {
    return 0;
  }
  write_null_cb_cold_1();
  aStack_5c8 = (anon_union_8_2_13e1ed65_for_data)loop;
  uStack_8c0 = uv_buf_init("",1);
  iVar2 = uv_pipe((uv_os_fd_t *)(auStack_8d8 + 0x10),0,0);
  if (iVar2 == 0) {
    init_process_options("spawn_helper4",exit_cb);
    options.stdio_count = 3;
    options.stdio = &uStack_600;
    uStack_600.flags = UV_INHERIT_FD;
    uStack_600.data.file = auStack_8d8._16_4_;
    uStack_5f0 = 0;
    uStack_5e0 = 0;
    puVar5 = uv_default_loop();
    iVar2 = uv_spawn(puVar5,&process,&options);
    uStack_8a8.data = (void *)(long)iVar2;
    uStack_6e8.data = (void *)0x0;
    if ((uv_handle_t *)uStack_8a8.data != (uv_handle_t *)0x0) goto LAB_001bfaf5;
    uv_unref((uv_handle_t *)&process);
    puVar5 = uv_default_loop();
    iVar2 = uv_pipe_init(puVar5,&uStack_6e8,0);
    uStack_8a8.data = (void *)(long)iVar2;
    auStack_8d8._0_8_ = (uv_loop_t *)0x0;
    if ((uv_handle_t *)uStack_8a8.data != (uv_handle_t *)0x0) goto LAB_001bfb07;
    iVar2 = uv_pipe_open(&uStack_6e8,auStack_8d8._16_4_);
    uStack_8a8.data = (void *)(long)iVar2;
    auStack_8d8._0_8_ = (uv_loop_t *)0x0;
    if ((uv_handle_t *)uStack_8a8.data != (uv_handle_t *)0x0) goto LAB_001bfb16;
    auStack_8d8._16_4_ = ~UV_UNKNOWN_HANDLE;
    iVar2 = uv_read_start((uv_stream_t *)&uStack_6e8,on_alloc,on_read_once);
    uStack_8a8.data = (void *)(long)iVar2;
    auStack_8d8._0_8_ = (uv_loop_t *)0x0;
    if ((uv_handle_t *)uStack_8a8.data != (uv_handle_t *)0x0) goto LAB_001bfb25;
    auStack_8d8._0_8_ = (uv_loop_t *)0x1;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&uStack_8a8,auStack_8d8._20_4_,&uStack_8c0,1,-1,
                        (uv_fs_cb)0x0);
    auStack_8d8._8_8_ = SEXT48(iVar2);
    if (auStack_8d8._0_8_ != auStack_8d8._8_8_) goto LAB_001bfb34;
    auStack_8d8._0_8_ = (uv_loop_t *)0x1;
    auStack_8d8._8_8_ = uStack_8a8.result;
    if ((uv_loop_t *)uStack_8a8.result != (uv_loop_t *)0x1) goto LAB_001bfb43;
    uv_fs_req_cleanup(&uStack_8a8);
    puVar5 = uv_default_loop();
    iVar2 = uv_run(puVar5,UV_RUN_ONCE);
    auStack_8d8._0_8_ = SEXT48(iVar2);
    auStack_8d8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_8d8._0_8_ != (uv_loop_t *)0x0) goto LAB_001bfb52;
    auStack_8d8._0_8_ = (uv_loop_t *)0x1;
    auStack_8d8._8_8_ = SEXT48(output_used);
    if ((uv_loop_t *)auStack_8d8._8_8_ != (uv_loop_t *)0x1) goto LAB_001bfb61;
    uv_close((uv_handle_t *)&uStack_6e8,close_cb);
    auStack_8d8._0_8_ = (uv_loop_t *)0x1;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&uStack_8a8,auStack_8d8._20_4_,&uStack_8c0,1,-1,
                        (uv_fs_cb)0x0);
    auStack_8d8._8_8_ = SEXT48(iVar2);
    if (auStack_8d8._0_8_ != auStack_8d8._8_8_) goto LAB_001bfb70;
    auStack_8d8._0_8_ = (uv_loop_t *)0x1;
    auStack_8d8._8_8_ = uStack_8a8.result;
    if ((uv_loop_t *)uStack_8a8.result != (uv_loop_t *)0x1) goto LAB_001bfb7f;
    uv_fs_req_cleanup(&uStack_8a8);
    puVar5 = uv_default_loop();
    iVar2 = uv_timer_init(puVar5,&timer);
    auStack_8d8._0_8_ = SEXT48(iVar2);
    auStack_8d8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_8d8._0_8_ != (uv_loop_t *)0x0) goto LAB_001bfb8e;
    iVar2 = uv_timer_start(&timer,timer_counter_cb,10,0);
    auStack_8d8._0_8_ = SEXT48(iVar2);
    auStack_8d8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_8d8._0_8_ != (uv_loop_t *)0x0) goto LAB_001bfb9d;
    puVar5 = uv_default_loop();
    iVar2 = uv_run(puVar5,UV_RUN_ONCE);
    if (iVar2 == 1) {
      puVar5 = uv_default_loop();
      iVar2 = uv_run(puVar5,UV_RUN_ONCE);
      auStack_8d8._0_8_ = SEXT48(iVar2);
      auStack_8d8._8_8_ = (uv_loop_t *)0x0;
      if ((uv_loop_t *)auStack_8d8._0_8_ != (uv_loop_t *)0x0) goto LAB_001bfbe8;
    }
    auStack_8d8._0_8_ = (uv_loop_t *)0x1;
    auStack_8d8._8_8_ = SEXT48(timer_counter);
    if ((uv_loop_t *)auStack_8d8._8_8_ != (uv_loop_t *)0x1) goto LAB_001bfbac;
    iVar2 = uv_process_kill(&process,0xf);
    auStack_8d8._0_8_ = SEXT48(iVar2);
    auStack_8d8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_8d8._0_8_ != (uv_loop_t *)0x0) goto LAB_001bfbbb;
    iVar2 = close(auStack_8d8._20_4_);
    auStack_8d8._0_8_ = SEXT48(iVar2);
    auStack_8d8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_8d8._0_8_ != (uv_loop_t *)0x0) goto LAB_001bfbca;
    auStack_8d8._20_4_ = -1;
    puVar5 = uv_default_loop();
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    uv_run(puVar5,UV_RUN_DEFAULT);
    auStack_8d8._0_8_ = (uv_loop_t *)0x0;
    puVar5 = uv_default_loop();
    iVar2 = uv_loop_close(puVar5);
    auStack_8d8._8_8_ = SEXT48(iVar2);
    if (auStack_8d8._0_8_ == auStack_8d8._8_8_) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_closed_fd_events_cold_1();
LAB_001bfaf5:
    run_test_closed_fd_events_cold_2();
LAB_001bfb07:
    run_test_closed_fd_events_cold_3();
LAB_001bfb16:
    run_test_closed_fd_events_cold_4();
LAB_001bfb25:
    run_test_closed_fd_events_cold_5();
LAB_001bfb34:
    run_test_closed_fd_events_cold_6();
LAB_001bfb43:
    run_test_closed_fd_events_cold_7();
LAB_001bfb52:
    run_test_closed_fd_events_cold_8();
LAB_001bfb61:
    run_test_closed_fd_events_cold_9();
LAB_001bfb70:
    run_test_closed_fd_events_cold_10();
LAB_001bfb7f:
    run_test_closed_fd_events_cold_11();
LAB_001bfb8e:
    run_test_closed_fd_events_cold_12();
LAB_001bfb9d:
    run_test_closed_fd_events_cold_13();
LAB_001bfbac:
    run_test_closed_fd_events_cold_15();
LAB_001bfbbb:
    run_test_closed_fd_events_cold_16();
LAB_001bfbca:
    run_test_closed_fd_events_cold_17();
  }
  run_test_closed_fd_events_cold_18();
LAB_001bfbe8:
  stream = (uv_stream_t *)auStack_8d8;
  nread = auStack_8d8 + 8;
  run_test_closed_fd_events_cold_14();
  uv_read_stop(stream);
  on_read(stream,(ssize_t)nread,buf);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(spawn_affinity) {
#if defined(NO_CPU_AFFINITY)
  RETURN_SKIP(NO_CPU_AFFINITY);
#else
  int i;
  int r;
  int cpu;
  char cpustr[11];
  char* newmask;
  int cpumask_size;
#if defined(_WIN32)
  DWORD_PTR procmask;
  DWORD_PTR sysmask;
#elif defined(__linux__)
  cpu_set_t cpuset;
#else
  cpuset_t cpuset;
#endif

  cpumask_size = uv_cpumask_size();
  ASSERT(cpumask_size > 0);

  /* find a cpu we can use */
  cpu = cpumask_size;
#ifdef _WIN32
  r = GetProcessAffinityMask(GetCurrentProcess(), &procmask, &sysmask);
  ASSERT_NE(r, 0);
  for (i = 0; i < cpumask_size; ++i) {
    if (procmask & (((DWORD_PTR)1) << i)) {
      cpu = i;
      break;
    }
  }
#else
  CPU_ZERO(&cpuset);
#ifdef __linux__
  r = sched_getaffinity(0, sizeof(cpuset), &cpuset);
  if (r)
    r = errno;
  else
    r = 0;
#else
  r = pthread_getaffinity_np(pthread_self(), sizeof(cpuset), &cpuset);
#endif
  ASSERT_EQ(r, 0);
  for (i = 0; i < cpumask_size; ++i) {
    if (CPU_ISSET(i, &cpuset)) {
      cpu = i;
      break;
    }
  }
#endif
  ASSERT_LT(cpu, cpumask_size);
  snprintf(cpustr, sizeof(cpustr), "%d", cpu);

  init_process_options("spawn_helper_affinity", exit_cb);

  /* mask the child to just one cpu */
  newmask = (char*)calloc(cpumask_size, 1);
  ASSERT(newmask != NULL);
  newmask[cpu] = 1;
  options.cpumask_size = (size_t)cpumask_size;
  options.cpumask = newmask;

  /* tell the child which one it should get */
  options.args[2] = cpustr;
  options.args[3] = "dummy"; /* need 4 args for test/run-tests.c dispatch */

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 1);

  free(newmask);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
#endif
}